

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O0

optional<metaf::Pressure> metaf::Pressure::fromString(string *s)

{
  _Optional_base<metaf::Pressure,_true,_true> _Var1;
  bool bVar2;
  int iVar3;
  long lVar4;
  optional<unsigned_int> oVar5;
  char *pcVar6;
  ulong in_RDI;
  size_t unaff_retaddr;
  string *in_stack_00000008;
  optional<unsigned_int> pr;
  Pressure pressure;
  Pressure *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  _Storage<unsigned_int,_true> _Var7;
  undefined8 local_10;
  size_t in_stack_fffffffffffffff8;
  
  lVar4 = std::__cxx11::string::length();
  if (lVar4 == 5) {
    Pressure((Pressure *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                            (char *)in_stack_ffffffffffffffb8);
    if (bVar2) {
      std::optional<metaf::Pressure>::optional<metaf::Pressure,_true>
                ((optional<metaf::Pressure> *)
                 CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                 in_stack_ffffffffffffffb8);
    }
    else {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                              (char *)in_stack_ffffffffffffffb8);
      if (bVar2) {
        std::optional<metaf::Pressure>::optional<metaf::Pressure,_true>
                  ((optional<metaf::Pressure> *)
                   CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   in_stack_ffffffffffffffb8);
      }
      else {
        oVar5 = strToUint(in_stack_00000008,unaff_retaddr,in_stack_fffffffffffffff8);
        _Var7._M_value =
             oVar5.super__Optional_base<unsigned_int,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_int>._M_payload;
        bVar2 = std::optional<unsigned_int>::has_value((optional<unsigned_int> *)0x25a5e9);
        if (bVar2) {
          pcVar6 = (char *)std::__cxx11::string::operator[](in_RDI);
          iVar3 = (int)*pcVar6;
          if (iVar3 == 0x41) {
            std::optional<unsigned_int>::operator*((optional<unsigned_int> *)0x25a643);
            std::optional<float>::optional<float,_true>
                      ((optional<float> *)CONCAT44(iVar3,in_stack_ffffffffffffffc0),
                       (float *)in_stack_ffffffffffffffb8);
          }
          else {
            if (iVar3 != 0x51) {
              local_10 = (_Optional_payload_base<float>)0;
              in_stack_fffffffffffffff8 = 0;
              goto LAB_0025a6c1;
            }
            std::optional<unsigned_int>::operator*((optional<unsigned_int> *)0x25a689);
            std::optional<float>::operator=
                      ((optional<float> *)CONCAT44(_Var7._M_value,in_stack_ffffffffffffffd0),
                       (uint *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
          }
          std::optional<metaf::Pressure>::optional<metaf::Pressure,_true>
                    ((optional<metaf::Pressure> *)CONCAT44(iVar3,in_stack_ffffffffffffffc0),
                     in_stack_ffffffffffffffb8);
        }
        else {
          local_10 = (_Optional_payload_base<float>)0;
          in_stack_fffffffffffffff8 = 0;
        }
      }
    }
  }
  else {
    local_10 = (_Optional_payload_base<float>)0;
    in_stack_fffffffffffffff8 = 0;
  }
LAB_0025a6c1:
  _Var1._M_payload.super__Optional_payload_base<metaf::Pressure>._8_8_ = in_stack_fffffffffffffff8;
  _Var1._M_payload.super__Optional_payload_base<metaf::Pressure>._M_payload._M_value.pressureValue.
  super__Optional_base<float,_true,_true>._M_payload.super__Optional_payload_base<float> =
       (optional<float>)(optional<float>)local_10;
  return (_Optional_base<metaf::Pressure,_true,_true>)
         (_Optional_base<metaf::Pressure,_true,_true>)
         _Var1._M_payload.super__Optional_payload_base<metaf::Pressure>;
}

Assistant:

std::optional<Pressure> Pressure::fromString(const std::string & s) {
	//static const std::regex rgx("([QA])(?:(\\d\\d\\d\\d)|////)");
	static const std::optional<Pressure> error;
	if (s.length() != 5) return error;
	Pressure pressure;
	if (s == "A////") {
		pressure.pressureUnit = Unit::INCHES_HG;
		return pressure;
	}
	if (s == "Q////") {
		pressure.pressureUnit = Unit::HECTOPASCAL;
		return pressure;
	}
	const auto pr = strToUint(s, 1, 4);
	if (!pr.has_value()) return error;
	switch (s[0]) {
		case 'A':
			pressure.pressureUnit = Unit::INCHES_HG;
			pressure.pressureValue = *pr * inHgDecimalPointShift;
			break;
		case 'Q':
			pressure.pressureUnit = Unit::HECTOPASCAL;
			pressure.pressureValue = *pr;
			break;
		default:  return error;
	}
	return pressure;
}